

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O2

void __thiscall
slang::ast::CheckerInstanceSymbol::visitExprs<no_old_always_syntax::MainVisitor&>
          (CheckerInstanceSymbol *this,AlwaysFFVisitor *visitor)

{
  AlwaysFFVisitor *in_RAX;
  Expression *this_00;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  __extent_storage<18446744073709551615UL> _Var1;
  long lVar2;
  Connection *conn;
  Connection *this_01;
  variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
  *pvVar3;
  span<const_slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL> sVar4;
  anon_class_8_1_9f2c674e local_38;
  
  local_38.visitor = in_RAX;
  sVar4 = getPortConnections(this);
  pvVar3 = &(sVar4._M_ptr)->actual;
  lVar2 = sVar4._M_extent._M_extent_value._M_extent_value * 0x48;
  while( true ) {
    this_01 = sVar4._M_ptr;
    if (lVar2 == 0) break;
    if (this_01->formal->kind == FormalArgument) {
      local_38.visitor = visitor;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__deduce_visit_result<void>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/../include/slang/ast/ASTVisitor.h:427:17)_&&,_const_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_&>
        ::_S_vtable._M_arr
        [(pvVar3->
         super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
         ).
         super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
         .
         super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
         .
         super__Move_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
         .
         super__Copy_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
         .
         super__Variant_storage_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
         ._M_index]._M_data)(&local_38,pvVar3);
    }
    this_00 = Connection::getOutputInitialExpr(this_01);
    _Var1._M_extent_value = extraout_RDX;
    if (this_00 != (Expression *)0x0) {
      Expression::visit<no_old_always_syntax::MainVisitor&>(this_00,visitor);
      _Var1._M_extent_value = extraout_RDX_00;
    }
    sVar4._M_extent._M_extent_value = _Var1._M_extent_value;
    sVar4._M_ptr = this_01 + 1;
    pvVar3 = (variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
              *)((long)&pvVar3[4].
                        super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                        .
                        super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                        .
                        super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                        .
                        super__Move_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                        .
                        super__Copy_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                + 8);
    lVar2 = lVar2 + -0x48;
  }
  return;
}

Assistant:

void CheckerInstanceSymbol::visitExprs(TVisitor&& visitor) const {
    for (auto& conn : getPortConnections()) {
        // Note: we only visit output arguments here, since input arguments
        // get rewritten into the checker instance body.
        if (conn.formal.kind == SymbolKind::FormalArgument) {
            std::visit(
                [&](auto&& arg) {
                    if (arg)
                        arg->visit(visitor);
                },
                conn.actual);
        }
        if (auto expr = conn.getOutputInitialExpr())
            expr->visit(visitor);
    }
}